

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammarResolver.cpp
# Opt level: O2

void __thiscall xercesc_4_0::GrammarResolver::resetCachedGrammar(GrammarResolver *this)

{
  (*this->fGrammarPool->_vptr_XMLGrammarPool[6])();
  RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::removeAll(this->fGrammarFromPool)
  ;
  return;
}

Assistant:

void GrammarResolver::resetCachedGrammar()
{
    //REVISIT: if the pool is locked this will fail... should throw an exception?
    fGrammarPool->clear();
    // Even though fXSModel and fGrammarPoolXSModel will be invalid don't touch 
    // them here as getXSModel will handle this.

    //to clear all other references to the grammars just deleted from fGrammarPool
    fGrammarFromPool->removeAll(); 

}